

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_rawfile_open(char *filename,int rwmode,int *hdl)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  undefined7 uVar5;
  long __off;
  size_t sVar4;
  undefined8 extraout_RDX;
  undefined4 uVar6;
  undefined8 unaff_RBP;
  char *pcVar7;
  uint naxis;
  double *dvalues;
  long lVar8;
  size_t __n;
  long nvals;
  int status;
  FILE *diskfile;
  char *cptr2;
  long dim [5];
  fitsfile *fptr;
  char rootfile [1025];
  int local_4b4;
  byte *local_4b0;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  int local_494;
  FILE *local_490;
  byte *local_488;
  size_t local_480;
  undefined4 local_474;
  undefined4 local_470;
  undefined4 local_46c;
  long local_468;
  long lStack_460;
  long local_458;
  long lStack_450;
  long local_448;
  fitsfile *local_440;
  char local_438 [1032];
  
  local_468 = 1;
  lStack_460 = 1;
  local_458 = 1;
  lStack_450 = 1;
  local_448 = 1;
  local_480 = 0;
  local_4b0 = (byte *)0x0;
  local_488 = (byte *)0x0;
  if (rwmode != 0) {
    ffpmsg("cannot open raw binary file with WRITE access (mem_rawfile_open)");
    ffpmsg(filename);
    return 0x70;
  }
  pbVar3 = (byte *)strchr(filename,0x5b);
  if (pbVar3 == (byte *)0x0) {
    pcVar7 = "binary file name missing \'[\' character (mem_rawfile_open)";
    local_4b0 = (byte *)0x0;
    goto LAB_0011847a;
  }
  local_438[0] = '\0';
  local_4b0 = pbVar3;
  strncat(local_438,filename,(long)pbVar3 - (long)filename);
  local_4b0 = pbVar3 + 1;
  do {
    pbVar3 = local_4b0;
    bVar1 = *pbVar3;
    local_4b0 = pbVar3 + 1;
  } while (bVar1 == 0x20);
  uVar5 = (undefined7)((ulong)pbVar3 >> 8);
  if (bVar1 < 0x62) {
    switch(bVar1) {
    case 0x42:
      goto switchD_00118471_caseD_42;
    case 0x44:
      goto switchD_00118471_caseD_44;
    case 0x46:
      goto switchD_00118471_caseD_46;
    case 0x49:
      goto switchD_00118471_caseD_49;
    case 0x4a:
      goto switchD_00118471_caseD_4a;
    default:
      if (bVar1 == 0x52) goto switchD_00118471_caseD_46;
      if (bVar1 == 0x55) goto LAB_001184e9;
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
switchD_00118471_caseD_43:
      pcVar7 = "error in raw binary file datatype (mem_rawfile_open)";
      local_4b0 = pbVar3;
LAB_0011847a:
      ffpmsg(pcVar7);
      ffpmsg(filename);
      return 0x7d;
    }
  }
  switch(bVar1) {
  case 0x62:
switchD_00118471_caseD_42:
    lVar8 = 1;
    local_494 = 8;
    uVar6 = 0;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
    goto switchD_00118471_caseD_43;
  case 100:
switchD_00118471_caseD_44:
    lVar8 = 8;
    local_494 = -0x40;
    local_4a4 = (undefined4)CONCAT71(uVar5,1);
    uVar6 = 0;
    local_498 = 0;
    local_49c = 0;
    local_4a0 = 0;
    goto LAB_001185dd;
  case 0x66:
switchD_00118471_caseD_46:
    lVar8 = 4;
    local_494 = -0x20;
    local_4a0 = (undefined4)CONCAT71(uVar5,1);
    uVar6 = 0;
    local_498 = 0;
    local_49c = 0;
    goto LAB_001185d5;
  case 0x69:
switchD_00118471_caseD_49:
    lVar8 = 2;
    local_494 = 0x10;
    local_498 = (undefined4)CONCAT71(uVar5,1);
    uVar6 = 0;
    goto LAB_001185c5;
  case 0x6a:
switchD_00118471_caseD_4a:
    lVar8 = 4;
    local_494 = 0x20;
    local_49c = (undefined4)CONCAT71(uVar5,1);
    uVar6 = 0;
    local_498 = 0;
    goto LAB_001185cd;
  default:
    if (bVar1 == 0x72) goto switchD_00118471_caseD_46;
    if (bVar1 != 0x75) goto switchD_00118471_caseD_43;
LAB_001184e9:
    lVar8 = 2;
    local_494 = 0x14;
    uVar6 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  local_498 = 0;
LAB_001185c5:
  local_49c = 0;
LAB_001185cd:
  local_4a0 = 0;
LAB_001185d5:
  local_4a4 = 0;
LAB_001185dd:
  bVar1 = *local_4b0;
  local_470 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  local_46c = 0;
  if (bVar1 < 0x62) {
    if (bVar1 == 0x42) {
LAB_00118605:
      local_4b0 = pbVar3 + 2;
      local_46c = 1;
      local_470 = 0;
      goto LAB_0011861d;
    }
    if (bVar1 != 0x4c) goto LAB_0011861d;
  }
  else if (bVar1 != 0x6c) {
    if (bVar1 != 0x62) goto LAB_0011861d;
    goto LAB_00118605;
  }
  local_4b0 = pbVar3 + 2;
  local_46c = 0;
LAB_0011861d:
  local_468 = strtol((char *)local_4b0,(char **)&local_488,10);
  naxis = 1;
  if ((local_488 != (byte *)0x0) && (*local_488 == 0x2c)) {
    lStack_460 = strtol((char *)(local_488 + 1),(char **)&local_4b0,10);
    naxis = 2;
    if ((local_4b0 != (byte *)0x0) && (*local_4b0 == 0x2c)) {
      local_458 = strtol((char *)(local_4b0 + 1),(char **)&local_488,10);
      naxis = 3;
      if ((local_488 != (byte *)0x0) && (*local_488 == 0x2c)) {
        lStack_450 = strtol((char *)(local_488 + 1),(char **)&local_4b0,10);
        if (local_4b0 == (byte *)0x0) {
          naxis = 4;
        }
        else {
          naxis = *local_4b0 == 0x2c | 4;
        }
        local_448 = strtol((char *)(local_4b0 + 1),(char **)&local_488,10);
      }
    }
  }
  pbVar3 = local_488;
  if (local_488 < local_4b0) {
    pbVar3 = local_4b0;
  }
  local_4b0 = pbVar3;
  if (*pbVar3 == 0x3a) {
    __off = strtol((char *)(pbVar3 + 1),(char **)0x0,10);
  }
  else {
    __off = 0;
  }
  nvals = lStack_460 * local_468 * local_458 * lStack_450 * local_448;
  __n = lVar8 * nvals;
  local_480 = ((__n + 0xb3f) / 0xb40) * 0xb40 + 0xb40;
  local_4b4 = file_openfile(local_438,0,(FILE **)&local_490);
  if (local_4b4 == 0) {
    local_4b4 = mem_createmem(local_480,hdl);
    if (local_4b4 != 0) {
      ffpmsg("failed to create memory file (mem_rawfile_open)");
      fclose(local_490);
      return local_4b4;
    }
    local_474 = uVar6;
    ffimem(&local_440,memTable[*hdl].memaddrptr,&local_480,0,(_func_void_ptr_void_ptr_size_t *)0x0,
           &local_4b4);
    ffcrim(local_440,local_494,naxis,&local_468,&local_4b4);
    ffclos(local_440,&local_4b4);
    if (0 < local_4b4) {
      ffpmsg("failed to write basic image header (mem_rawfile_open)");
      fclose(local_490);
      iVar2 = *hdl;
      free(*memTable[iVar2].memaddrptr);
      memTable[iVar2].memaddrptr = (char **)0x0;
      memTable[iVar2].memaddr = (char *)0x0;
      return local_4b4;
    }
    if (0 < __off) {
      fseek(local_490,__off,0);
    }
    pcVar7 = *memTable[*hdl].memaddrptr;
    dvalues = (double *)(pcVar7 + 0xb40);
    sVar4 = fread(dvalues,1,__n,local_490);
    uVar6 = local_474;
    if (sVar4 != __n) {
      local_4b4 = 0x6c;
    }
    fclose(local_490);
    if (local_4b4 == 0) {
      if ((byte)uVar6 != 0) {
        if ((char)local_470 == '\0') {
          if (0 < nvals) {
            lVar8 = 0;
            do {
              pbVar3 = (byte *)((long)dvalues + lVar8 * 2);
              *pbVar3 = *pbVar3 ^ 0x80;
              lVar8 = lVar8 + 1;
            } while (nvals - lVar8 != 0);
          }
        }
        else if (0 < nvals) {
          lVar8 = 0;
          do {
            pbVar3 = (byte *)(pcVar7 + lVar8 * 2 + 0xb41);
            *pbVar3 = *pbVar3 ^ 0x80;
            lVar8 = lVar8 + 1;
          } while (nvals - lVar8 != 0);
        }
      }
      if ((char)local_46c == '\0') {
        if ((byte)((byte)uVar6 | (byte)local_498) == 1) {
          ffswap2((short *)dvalues,nvals);
        }
        else if ((byte)((byte)local_49c | (byte)local_4a0) == 1) {
          ffswap4((int *)dvalues,nvals);
        }
        else if ((char)local_4a4 != '\0') {
          ffswap8(dvalues,nvals);
        }
      }
      iVar2 = *hdl;
      memTable[iVar2].currentpos = 0;
      memTable[iVar2].fitsfilesize = local_480;
      return 0;
    }
    iVar2 = *hdl;
    free(*memTable[iVar2].memaddrptr);
    memTable[iVar2].memaddrptr = (char **)0x0;
    memTable[iVar2].memaddr = (char *)0x0;
    pcVar7 = "failed to copy raw file data into memory (mem_rawfile_open)";
  }
  else {
    ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
    pcVar7 = local_438;
  }
  ffpmsg(pcVar7);
  return local_4b4;
}

Assistant:

int mem_rawfile_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, writes a minimal
  image header, then copies the image data from the raw file into
  memory.  It will byteswap the pixel values if the raw array
  is in little endian byte order.
*/
{
    FILE *diskfile;
    fitsfile *fptr;
    short *sptr;
    int status, endian, datatype, bytePerPix, naxis;
    long dim[5] = {1,1,1,1,1}, ii, nvals, offset = 0;
    size_t filesize = 0, datasize;
    char rootfile[FLEN_FILENAME], *cptr = 0, *cptr2 = 0;
    void *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open raw binary file with WRITE access (mem_rawfile_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    cptr = strchr(filename, '[');   /* search for opening bracket [ */

    if (!cptr)
    {
        ffpmsg("binary file name missing '[' character (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    *rootfile = '\0';
    strncat(rootfile, filename, cptr - filename);  /* store the rootname */

    cptr++;

    while (*cptr == ' ')
       cptr++;    /* skip leading blanks */

    /* Get the Data Type of the Image */

    if (*cptr == 'b' || *cptr == 'B')
    {
      datatype = BYTE_IMG;
      bytePerPix = 1;
    }
    else if (*cptr == 'i' || *cptr == 'I')
    {
      datatype = SHORT_IMG;
      bytePerPix = 2;
    }
    else if (*cptr == 'u' || *cptr == 'U')
    {
      datatype = USHORT_IMG;
      bytePerPix = 2;

    }
    else if (*cptr == 'j' || *cptr == 'J')
    {
      datatype = LONG_IMG;
      bytePerPix = 4;
    }  
    else if (*cptr == 'r' || *cptr == 'R' || *cptr == 'f' || *cptr == 'F')
    {
      datatype = FLOAT_IMG;
      bytePerPix = 4;
    }    
    else if (*cptr == 'd' || *cptr == 'D')
    {
      datatype = DOUBLE_IMG;
      bytePerPix = 8;
    }
    else
    {
        ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    cptr++;

    /* get Endian: Big or Little; default is same as the local machine */
    
    if (*cptr == 'b' || *cptr == 'B')
    {
        endian = 0;
        cptr++;
    }
    else if (*cptr == 'l' || *cptr == 'L')
    {
        endian = 1;
        cptr++;
    }
    else
        endian = BYTESWAPPED; /* byteswapped machines are little endian */

    /* read each dimension (up to 5) */

    naxis = 1;
    dim[0] = strtol(cptr, &cptr2, 10);
    
    if (cptr2 && *cptr2 == ',')
    {
      naxis = 2;
      dim[1] = strtol(cptr2+1, &cptr, 10);

      if (cptr && *cptr == ',')
      {
        naxis = 3;
        dim[2] = strtol(cptr+1, &cptr2, 10);

        if (cptr2 && *cptr2 == ',')
        {
          naxis = 4;
          dim[3] = strtol(cptr2+1, &cptr, 10);

          if (cptr && *cptr == ',')
            naxis = 5;
            dim[4] = strtol(cptr+1, &cptr2, 10);
        }
      }
    }

    cptr = maxvalue(cptr, cptr2);

    if (*cptr == ':')   /* read starting offset value */
        offset = strtol(cptr+1, 0, 10);

    nvals = dim[0] * dim[1] * dim[2] * dim[3] * dim[4];
    datasize = nvals * bytePerPix;
    filesize = nvals * bytePerPix + 2880;
    filesize = ((filesize - 1) / 2880 + 1) * 2880; 

    /* open the raw binary disk file */
    status = file_openfile(rootfile, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg(rootfile);
        return(status);
    }

    /* create a memory file with corrct size for the FITS converted raw file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create memory file (mem_rawfile_open)");
        fclose(diskfile);
        return(status);
    }

    /* open this piece of memory as a new FITS file */
    ffimem(&fptr, (void **) memTable[*hdl].memaddrptr, &filesize, 0, 0, &status);

    /* write the required header keywords */
    ffcrim(fptr, datatype, naxis, dim, &status);

    /* close the FITS file, but keep the memory allocated */
    ffclos(fptr, &status);

    if (status > 0)
    {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(diskfile);
        mem_close_free(*hdl);   /* free up the memory */
        return(status);
    }

    if (offset > 0)
       fseek(diskfile, offset, 0);   /* offset to start of the data */

    /* read the raw data into memory */
    ptr = *memTable[*hdl].memaddrptr + 2880;

    if (fread((char *) ptr, 1, datasize, diskfile) != datasize)
      status = READ_ERROR;

    fclose(diskfile);  /* close the raw binary disk file */

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        return(status);
    }

    if (datatype == USHORT_IMG)  /* have to subtract 32768 from each unsigned */
    {                            /* value to conform to FITS convention. More */
                                 /* efficient way to do this is to just flip  */
                                 /* the most significant bit.                 */

      sptr = (short *) ptr;

      if (endian == BYTESWAPPED)  /* working with native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x8000;
        }
      }
      else  /* pixels are byteswapped WRT the native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x80;
        }
      }
    }

    if (endian)  /* swap the bytes if array is in little endian byte order */
    {
      if (datatype == SHORT_IMG || datatype == USHORT_IMG)
      {
        ffswap2( (short *) ptr, nvals);
      }
      else if (datatype == LONG_IMG || datatype == FLOAT_IMG)
      {
        ffswap4( (INT32BIT *) ptr, nvals);
      }

      else if (datatype == DOUBLE_IMG)
      {
        ffswap8( (double *) ptr, nvals);
      }
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;    /* and initial file size  */

    return(0);
}